

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O0

Generation * Generation::create(string *path,int umask,bool isToken)

{
  byte in_DL;
  string *in_RDI;
  Generation *gen;
  string local_40 [19];
  undefined1 in_stack_ffffffffffffffd3;
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  Generation *in_stack_ffffffffffffffe0;
  Generation *local_8;
  
  local_8 = (Generation *)operator_new(0x40);
  std::__cxx11::string::string(local_40,in_RDI);
  Generation(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             (bool)in_stack_ffffffffffffffd3);
  std::__cxx11::string::~string(local_40);
  if (((local_8 != (Generation *)0x0) && ((in_DL & 1) != 0)) && (local_8->genMutex == (Mutex *)0x0))
  {
    if (local_8 != (Generation *)0x0) {
      (*local_8->_vptr_Generation[1])();
    }
    local_8 = (Generation *)0x0;
  }
  return local_8;
}

Assistant:

Generation* Generation::create(const std::string path, int umask, bool isToken)
{
	Generation* gen = new Generation(path, umask, isToken);
	if ((gen != NULL) && isToken && (gen->genMutex == NULL))
	{
		delete gen;

		return NULL;
	}
	return gen;
}